

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O1

bool __thiscall llvm::APInt::ult(APInt *this,uint64_t RHS)

{
  uint uVar1;
  uint uVar2;
  uint64_t uVar3;
  
  uVar1 = this->BitWidth;
  if ((0x40 < uVar1) && (uVar2 = countLeadingZerosSlowCase(this), 0x40 < uVar1 - uVar2)) {
    return false;
  }
  uVar3 = getZExtValue(this);
  return uVar3 < RHS;
}

Assistant:

bool ult(uint64_t RHS) const {
    // Only need to check active bits if not a single word.
    return (isSingleWord() || getActiveBits() <= 64) && getZExtValue() < RHS;
  }